

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall helics::ValueFederate::loadFederateData(ValueFederate *this)

{
  bool bVar1;
  pointer pVVar2;
  unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  *in_RDI;
  ValueFederate **unaff_retaddr;
  Core **in_stack_00000008;
  string *in_stack_00000018;
  ValueFederate *in_stack_00000020;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  byte bVar3;
  bool *in_stack_fffffffffffffff0;
  unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  *__args_2;
  
  __args_2 = in_RDI;
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&in_RDI[3]._M_t.
                     super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                     .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl +
             *(long *)((long)&(in_RDI->_M_t).
                              super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                              .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                              _M_head_impl[-1].inputTargets.m_mutex + 0x28)));
  Federate::getID((Federate *)
                  ((long)&(in_RDI->_M_t).
                          super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                          .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl
                  + *(long *)((long)&(in_RDI->_M_t).
                                     super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                                     .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                                     _M_head_impl[-1].inputTargets.m_mutex + 0x28)));
  std::
  make_unique<helics::ValueFederateManager,helics::Core*,helics::ValueFederate*,helics::LocalFederateId,bool&>
            (in_stack_00000008,unaff_retaddr,(LocalFederateId *)__args_2,in_stack_fffffffffffffff0);
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator=(in_RDI,(unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                      *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::~unique_ptr(in_RDI);
  bVar3 = *(byte *)((long)&in_RDI[1]._M_t.
                           super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                           .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                           _M_head_impl +
                   *(long *)((long)&(in_RDI->_M_t).
                                    super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                                    .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                                    _M_head_impl[-1].inputTargets.m_mutex + 0x28) + 3);
  pVVar2 = std::
           unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
           ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                         *)0x2823f5);
  pVVar2->useJsonSerialization = (bool)(bVar3 & 1);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x282413);
  if (!bVar1) {
    registerValueInterfaces(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}